

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

uint32_t ixgbe_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  long lVar1;
  byte bVar2;
  long *plVar3;
  long *plVar4;
  pkt_buf *ppVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint in_ECX;
  long in_RDX;
  ushort in_SI;
  long in_RDI;
  uint64_t diff;
  _Bool int_en;
  pkt_buf *new_buf;
  pkt_buf *buf;
  ixgbe_adv_rx_desc desc;
  uint32_t status;
  ixgbe_adv_rx_desc *desc_ptr;
  uint32_t buf_index;
  uint16_t last_rx_index;
  uint16_t rx_index;
  ixgbe_rx_queue *queue;
  _Bool interrupts_enabled;
  interrupt_queues *interrupt;
  ixy_device *__mptr;
  ixgbe_device *dev;
  int in_stack_ffffffffffffff5c;
  uint16_t queue_id_00;
  ixgbe_device *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  ushort uStack_6c;
  uint local_58;
  ushort local_54;
  ushort local_52;
  long local_40;
  
  local_40 = 0;
  bVar2 = *(byte *)(in_RDI + 0x58) & 1;
  if ((bVar2 != 0) &&
     (local_40 = *(long *)(in_RDI + 0x60) + (ulong)in_SI * 0x68, (*(byte *)(local_40 + 8) & 1) != 0)
     ) {
    vfio_epoll_wait(*(int *)(local_40 + 4),10,*(int *)(in_RDI + 0x6c));
  }
  plVar3 = (long *)(*(long *)(in_RDI + 0x78) + (long)(int)(uint)in_SI * 0x18);
  local_54 = *(ushort *)((long)plVar3 + 0x12);
  local_52 = local_54;
  for (local_58 = 0; local_58 < in_ECX; local_58 = local_58 + 1) {
    plVar4 = (long *)(*plVar3 + (long)(int)(uint)local_52 * 0x10);
    if ((*(uint *)(plVar4 + 1) & 1) == 0) break;
    if ((*(uint *)(plVar4 + 1) & 2) == 0) {
      fprintf(_stderr,
              "[ERROR] %s:%d %s(): multi-segment packets are not supported - increase buffer size or decrease MTU\n"
              ,"/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
              ,0x2a8,"ixgbe_rx_batch");
      abort();
    }
    lVar1 = plVar3[(ulong)local_52 + 3];
    uStack_6c = (ushort)((ulong)plVar4[1] >> 0x20);
    *(uint *)(lVar1 + 0x14) = (uint)uStack_6c;
    ppVar5 = pkt_buf_alloc((mempool *)in_stack_ffffffffffffff60);
    if (ppVar5 == (pkt_buf *)0x0) {
      fprintf(_stderr,
              "[ERROR] %s:%d %s(): failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small\n"
              ,"/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c"
              ,0x2b5,"ixgbe_rx_batch");
      abort();
    }
    *plVar4 = ppVar5->buf_addr_phy + 0x40;
    plVar4[1] = 0;
    plVar3[(ulong)local_52 + 3] = (long)ppVar5;
    *(long *)(in_RDX + (ulong)local_58 * 8) = lVar1;
    local_54 = local_52;
    local_52 = local_52 + 1 & (short)plVar3[2] - 1U;
  }
  if (local_52 != local_54) {
    in_stack_ffffffffffffff60 = *(ixgbe_device **)(in_RDI + 0x70);
    if (in_SI < 0x40) {
      in_stack_ffffffffffffff5c = (uint)in_SI * 0x40 + 0x1018;
    }
    else {
      in_stack_ffffffffffffff5c = (in_SI - 0x40) * 0x40 + 0xd018;
    }
    set_reg32((uint8_t *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(uint)local_54);
    *(ushort *)((long)plVar3 + 0x12) = local_52;
  }
  if (bVar2 != 0) {
    *(ulong *)(local_40 + 0x20) = (ulong)local_58 + *(long *)(local_40 + 0x20);
    uVar7 = *(ulong *)(local_40 + 0x18);
    *(ulong *)(local_40 + 0x18) = uVar7 + 1;
    if ((uVar7 & 0xfff) == 0) {
      bVar2 = *(byte *)(local_40 + 8) & 1;
      uVar6 = monotonic_time();
      uVar7 = uVar6 - *(long *)(local_40 + 0x10);
      if (*(ulong *)(local_40 + 0x28) < uVar7) {
        check_interrupt((interrupt_queues *)CONCAT17(bVar2,in_stack_ffffffffffffff70),uVar7,
                        (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (uint32_t)in_stack_ffffffffffffff60);
      }
      if ((bVar2 & 1) != (*(byte *)(local_40 + 8) & 1)) {
        queue_id_00 = (uint16_t)((uint)in_stack_ffffffffffffff5c >> 0x10);
        if ((*(byte *)(local_40 + 8) & 1) == 0) {
          disable_interrupt(in_stack_ffffffffffffff60,queue_id_00);
        }
        else {
          enable_interrupt(in_stack_ffffffffffffff60,queue_id_00);
        }
      }
    }
  }
  return local_58;
}

Assistant:

uint32_t ixgbe_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);

	struct interrupt_queues* interrupt = NULL;
	bool interrupts_enabled = ixy->interrupts.interrupts_enabled;

	if (interrupts_enabled) {
		interrupt = &ixy->interrupts.queues[queue_id];
	}

	if (interrupts_enabled && interrupt->interrupt_enabled) {
		vfio_epoll_wait(interrupt->vfio_epoll_fd, 10, dev->ixy.interrupts.timeout_ms);
	}

	struct ixgbe_rx_queue* queue = ((struct ixgbe_rx_queue*) (dev->rx_queues)) + queue_id;
	uint16_t rx_index = queue->rx_index; // rx index we checked in the last run of this function
	uint16_t last_rx_index = rx_index; // index of the descriptor we checked in the last iteration of the loop
	uint32_t buf_index;
	for (buf_index = 0; buf_index < num_bufs; buf_index++) {
		// rx descriptors are explained in 7.1.5
		volatile union ixgbe_adv_rx_desc* desc_ptr = queue->descriptors + rx_index;
		uint32_t status = desc_ptr->wb.upper.status_error;
		if (status & IXGBE_RXDADV_STAT_DD) {
			if (!(status & IXGBE_RXDADV_STAT_EOP)) {
				error("multi-segment packets are not supported - increase buffer size or decrease MTU");
			}
			// got a packet, read and copy the whole descriptor
			union ixgbe_adv_rx_desc desc = *desc_ptr;
			struct pkt_buf* buf = (struct pkt_buf*) queue->virtual_addresses[rx_index];
			buf->size = desc.wb.upper.length;
			// this would be the place to implement RX offloading by translating the device-specific flags
			// to an independent representation in the buf (similiar to how DPDK works)
			// need a new mbuf for the descriptor
			struct pkt_buf* new_buf = pkt_buf_alloc(queue->mempool);
			if (!new_buf) {
				// we could handle empty mempools more gracefully here, but it would be quite messy...
				// make your mempools large enough
				error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
			}
			// reset the descriptor
			desc_ptr->read.pkt_addr = new_buf->buf_addr_phy + offsetof(struct pkt_buf, data);
			desc_ptr->read.hdr_addr = 0; // this resets the flags
			queue->virtual_addresses[rx_index] = new_buf;
			bufs[buf_index] = buf;
			// want to read the next one in the next iteration, but we still need the last/current to update RDT later
			last_rx_index = rx_index;
			rx_index = wrap_ring(rx_index, queue->num_entries);
		} else {
			break;
		}
	}
	if (rx_index != last_rx_index) {
		// tell hardware that we are done
		// this is intentionally off by one, otherwise we'd set RDT=RDH if we are receiving faster than packets are coming in
		// RDT=RDH means queue is full
		set_reg32(dev->addr, IXGBE_RDT(queue_id), last_rx_index);
		queue->rx_index = rx_index;
	}

	if (interrupts_enabled) {
		interrupt->rx_pkts += buf_index;

		if ((interrupt->instr_counter++ & 0xFFF) == 0) {
			bool int_en = interrupt->interrupt_enabled;
			uint64_t diff = monotonic_time() - interrupt->last_time_checked;
			if (diff > interrupt->interval) {
				// every second
				check_interrupt(interrupt, diff, buf_index, num_bufs);
			}

			if (int_en != interrupt->interrupt_enabled) {
				if (interrupt->interrupt_enabled) {
					enable_interrupt(dev, queue_id);
				} else {
					disable_interrupt(dev, queue_id);
				}
			}
		}
	}

	return buf_index; // number of packets stored in bufs; buf_index points to the next index
}